

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,Script *locking_script,ConfidentialAssetId *asset,
          ConfidentialValue *confidential_value)

{
  Amount AVar1;
  Amount local_30;
  
  AVar1 = Amount::CreateBySatoshiAmount(0);
  local_30.amount_ = AVar1.amount_;
  local_30.ignore_check_ = AVar1.ignore_check_;
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut,&local_30,locking_script);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_00879628;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,asset);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,confidential_value);
  (this->nonce_)._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0086dcb8;
  ByteData::ByteData(&(this->nonce_).data_);
  (this->nonce_).version_ = '\0';
  ByteData::ByteData(&this->surjection_proof_);
  ByteData::ByteData(&this->range_proof_);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const Script &locking_script, const ConfidentialAssetId &asset,
    const ConfidentialValue &confidential_value)
    : AbstractTxOut(Amount::CreateBySatoshiAmount(0), locking_script),
      asset_(asset),
      confidential_value_(confidential_value),
      nonce_(),
      surjection_proof_(),
      range_proof_() {
  // do nothing
}